

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall
Apple::IIgs::Sound::GLU::generate_audio<(Outputs::Speaker::Action)1>
          (GLU *this,size_t number_of_samples,MonoSample *target)

{
  int16_t iVar1;
  long lVar2;
  Oscillator *pOVar3;
  uint local_40;
  int local_3c;
  int c;
  int output;
  size_t sample;
  uint32_t uStack_28;
  uint8_t uStack_22;
  uint8_t next_amplitude;
  MemoryWrite next_store;
  MonoSample *target_local;
  size_t number_of_samples_local;
  GLU *this_local;
  
  _uStack_28 = std::atomic<Apple::IIgs::Sound::GLU::MemoryWrite>::load
                         (this->pending_stores_ + this->pending_store_read_,memory_order_acquire);
  sample._7_1_ = 0xff;
  _c = 0;
  do {
    if (number_of_samples <= _c) {
      return;
    }
    local_3c = 0;
    for (local_40 = 0; (int)local_40 < (this->remote_).oscillator_count; local_40 = local_40 + 1) {
      if (((this->remote_).oscillators[(int)local_40].control & 1) == 0) {
        lVar2 = (long)(int)local_40;
        (this->remote_).oscillators[lVar2].position =
             (this->remote_).oscillators[lVar2].position +
             (uint)(this->remote_).oscillators[lVar2].velocity;
        switch((this->remote_).oscillators[(int)local_40].control & 6) {
        case 0:
          iVar1 = EnsoniqState::Oscillator::output
                            ((this->remote_).oscillators + (int)local_40,(this->remote_).ram_);
          local_3c = iVar1 + local_3c;
          break;
        case 2:
          if (((this->remote_).oscillators[(int)local_40].position &
              (this->remote_).oscillators[(int)local_40].overflow_mask) != 0) {
            (this->remote_).oscillators[(int)local_40].position = 0;
            (this->remote_).oscillators[(int)local_40].control =
                 (this->remote_).oscillators[(int)local_40].control | 1;
          }
          break;
        case 4:
          if ((local_40 & 1) != 0) {
            sample._7_1_ = EnsoniqState::Oscillator::sample
                                     ((this->remote_).oscillators + (int)local_40,
                                      (this->remote_).ram_);
            goto LAB_00539c24;
          }
          if (((this->remote_).oscillators[(int)local_40].position &
              (this->remote_).oscillators[(int)local_40].overflow_mask) != 0) {
            pOVar3 = (this->remote_).oscillators + (int)local_40;
            pOVar3->position =
                 (this->remote_).oscillators[(int)local_40].overflow_mask & pOVar3->position;
            (this->remote_).oscillators[(int)(local_40 + 1)].position = 0;
          }
          break;
        case 6:
          if (((this->remote_).oscillators[(int)local_40].position &
              (this->remote_).oscillators[(int)local_40].overflow_mask) != 0) {
            (this->remote_).oscillators[(int)local_40].control =
                 (this->remote_).oscillators[(int)local_40].control | 1;
            (this->remote_).oscillators[(int)local_40].position = 0;
            (this->remote_).oscillators[(int)(local_40 ^ 1)].control =
                 (this->remote_).oscillators[(int)(local_40 ^ 1)].control & 0xfe;
          }
        }
        if (((this->remote_).oscillators[(int)local_40].control & 1) == 0) {
          iVar1 = EnsoniqState::Oscillator::output
                            ((this->remote_).oscillators + (int)local_40,(this->remote_).ram_);
          local_3c = (int)((int)iVar1 * (uint)sample._7_1_) / 0xff + local_3c;
          sample._7_1_ = 0xff;
        }
      }
LAB_00539c24:
    }
    Outputs::Speaker::apply<(Outputs::Speaker::Action)1,short>
              (target + _c,(short)(local_3c * this->output_range_ >> 0x14));
    this->pending_store_read_time_ = this->pending_store_read_time_ + 1;
    if ((((ulong)_uStack_28 & 0x100000000000000) != 0) &&
       (uStack_28 == this->pending_store_read_time_)) {
      (this->remote_).ram_[(ulong)_uStack_28 >> 0x20 & 0xffff] = uStack_22;
      _uStack_28 = (MemoryWrite)((ulong)_uStack_28 & 0xffffffffffffff);
      std::atomic<Apple::IIgs::Sound::GLU::MemoryWrite>::store
                (this->pending_stores_ + this->pending_store_read_,_uStack_28,memory_order_relaxed);
      this->pending_store_read_ = this->pending_store_read_ + 1 & 0x3fff;
    }
    _c = _c + 1;
  } while( true );
}

Assistant:

void GLU::generate_audio(size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	auto next_store = pending_stores_[pending_store_read_].load(std::memory_order::memory_order_acquire);
	uint8_t next_amplitude = 255;
	for(size_t sample = 0; sample < number_of_samples; sample++) {

		// TODO: there's a bit of a hack here where it is assumed that the input clock has been
		// divided in advance. Real hardware divides by 8, I think?

		// Seed output as 0.
		int output = 0;

		// Apply phase updates to all enabled oscillators.
		for(int c = 0; c < remote_.oscillator_count; c++) {
			// Don't do anything for halted oscillators.
			if(remote_.oscillators[c].control&1) continue;

			remote_.oscillators[c].position += remote_.oscillators[c].velocity;

			// Test for a new halting event.
			switch(remote_.oscillators[c].control & 6) {
				case 0:	// Free-run mode; don't truncate the position at all, in case the
						// accumulator bits in use changes.
					output += remote_.oscillators[c].output(remote_.ram_);
				break;

				case 2:	// One-shot mode; check for end of run. Otherwise update sample.
					if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
						remote_.oscillators[c].position = 0;
						remote_.oscillators[c].control |= 1;
					}
				break;

				case 4:	// Sync/AM mode.
					if(c&1) {
						// Oscillator is odd-numbered; it will amplitude-modulate the next voice.
						next_amplitude = remote_.oscillators[c].sample(remote_.ram_);
						continue;
					} else {
						// Oscillator is even-numbered; it will 'sync' to the even voice, i.e. any
						// time it wraps around, it will reset the next oscillator.
						if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
							remote_.oscillators[c].position &= remote_.oscillators[c].overflow_mask;
							remote_.oscillators[c+1].position = 0;
						}
					}
				break;

				case 6:	// Swap mode; possibly trigger partner, and update sample.
						// Per tech note #11: "Whenever a swap occurs from a higher-numbered
						// oscillator to a lower-numbered one, the output signal from the corresponding
						// generator temporarily falls to the zero-crossing level (silence)"
					if(remote_.oscillators[c].position & remote_.oscillators[c].overflow_mask) {
						remote_.oscillators[c].control |= 1;
						remote_.oscillators[c].position = 0;
						remote_.oscillators[c^1].control &= ~1;
					}
				break;
			}

			// Don't add output for newly-halted oscillators.
			if(remote_.oscillators[c].control&1) continue;

			// Append new output.
			output += (remote_.oscillators[c].output(remote_.ram_) * next_amplitude) / 255;
			next_amplitude = 255;
		}

		// Maximum total output was 32 channels times a 16-bit range. Map that down.
		// TODO: dynamic total volume?
		Outputs::Speaker::apply<action>(
			target[sample],
			Outputs::Speaker::MonoSample(
				(output * output_range_) >> 20
			)
		);

		// Apply any RAM writes that interleave here.
		++pending_store_read_time_;
		if(!next_store.enabled) continue;
		if(next_store.time != pending_store_read_time_) continue;
		remote_.ram_[next_store.address] = next_store.value;
		next_store.enabled = false;
		pending_stores_[pending_store_read_].store(next_store, std::memory_order::memory_order_relaxed);
		pending_store_read_ = (pending_store_read_ + 1) & (StoreBufferSize - 1);
	}
}